

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  int new_size;
  uint uVar1;
  ImDrawList *pIVar2;
  ImDrawVert *pIVar3;
  undefined8 uVar4;
  ImVec2 IVar5;
  ImDrawVert *pIVar6;
  int j;
  long lVar7;
  int i;
  long lVar8;
  ImVector<ImDrawVert> local_38;
  
  local_38.Size = 0;
  local_38.Capacity = 0;
  local_38.Data = (ImDrawVert *)0x0;
  this->TotalIdxCount = 0;
  this->TotalVtxCount = 0;
  for (lVar8 = 0; lVar8 < this->CmdListsCount; lVar8 = lVar8 + 1) {
    pIVar2 = (this->CmdLists).Data[lVar8];
    new_size = (pIVar2->IdxBuffer).Size;
    if (new_size != 0) {
      ImVector<ImDrawVert>::resize(&local_38,new_size);
      pIVar6 = local_38.Data;
      for (lVar7 = 0; lVar7 < (pIVar2->IdxBuffer).Size; lVar7 = lVar7 + 1) {
        pIVar3 = (pIVar2->VtxBuffer).Data;
        uVar1 = (pIVar2->IdxBuffer).Data[lVar7];
        pIVar6->col = pIVar3[(int)uVar1].col;
        pIVar3 = pIVar3 + (int)uVar1;
        IVar5 = pIVar3->uv;
        pIVar6->pos = pIVar3->pos;
        pIVar6->uv = IVar5;
        pIVar6 = pIVar6 + 1;
      }
      uVar4._0_4_ = (pIVar2->VtxBuffer).Size;
      uVar4._4_4_ = (pIVar2->VtxBuffer).Capacity;
      (pIVar2->VtxBuffer).Size = local_38.Size;
      (pIVar2->VtxBuffer).Capacity = local_38.Capacity;
      pIVar6 = (pIVar2->VtxBuffer).Data;
      (pIVar2->VtxBuffer).Data = local_38.Data;
      local_38._0_8_ = uVar4;
      local_38.Data = pIVar6;
      ImVector<unsigned_int>::resize(&pIVar2->IdxBuffer,0);
      this->TotalVtxCount = this->TotalVtxCount + (pIVar2->VtxBuffer).Size;
    }
  }
  ImVector<ImDrawVert>::~ImVector(&local_38);
  return;
}

Assistant:

void ImDrawData::DeIndexAllBuffers()
{
    ImVector<ImDrawVert> new_vtx_buffer;
    TotalVtxCount = TotalIdxCount = 0;
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        if (cmd_list->IdxBuffer.empty())
            continue;
        new_vtx_buffer.resize(cmd_list->IdxBuffer.Size);
        for (int j = 0; j < cmd_list->IdxBuffer.Size; j++)
            new_vtx_buffer[j] = cmd_list->VtxBuffer[cmd_list->IdxBuffer[j]];
        cmd_list->VtxBuffer.swap(new_vtx_buffer);
        cmd_list->IdxBuffer.resize(0);
        TotalVtxCount += cmd_list->VtxBuffer.Size;
    }
}